

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O0

void process_restart(j_decompress_ptr cinfo)

{
  jpeg_entropy_decoder *pjVar1;
  jpeg_component_info *pjVar2;
  boolean bVar3;
  jpeg_component_info *compptr;
  int ci;
  arith_entropy_ptr_conflict entropy;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = cinfo->entropy;
  bVar3 = (*cinfo->marker->read_restart_marker)(cinfo);
  if (bVar3 == 0) {
    cinfo->err->msg_code = 0x19;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  for (compptr._4_4_ = 0; compptr._4_4_ < cinfo->comps_in_scan; compptr._4_4_ = compptr._4_4_ + 1) {
    pjVar2 = cinfo->cur_comp_info[compptr._4_4_];
    if ((cinfo->progressive_mode == 0) || ((cinfo->Ss == 0 && (cinfo->Ah == 0)))) {
      memset((&pjVar1[4].decode_mcu)[pjVar2->dc_tbl_no],0,0x40);
      *(undefined4 *)((long)&pjVar1[2].start_pass + (long)compptr._4_4_ * 4 + 4) = 0;
      *(undefined4 *)((long)&pjVar1[3].start_pass + (long)compptr._4_4_ * 4 + 4) = 0;
    }
    if (((cinfo->progressive_mode == 0) && (cinfo->lim_Se != 0)) ||
       ((cinfo->progressive_mode != 0 && (cinfo->Ss != 0)))) {
      memset((&pjVar1[0xc].decode_mcu)[pjVar2->ac_tbl_no],0,0x100);
    }
  }
  pjVar1[1].start_pass = (_func_void_j_decompress_ptr *)0x0;
  pjVar1[1].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0;
  *(undefined4 *)&pjVar1[2].start_pass = 0xfffffff0;
  *(uint *)((long)&pjVar1[4].start_pass + 4) = cinfo->restart_interval;
  return;
}

Assistant:

LOCAL(boolean)
process_restart (j_decompress_ptr cinfo)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  int ci;

  /* Throw away any unused bits remaining in bit buffer; */
  /* include any full bytes in next_marker's count of discarded bytes */
  cinfo->marker->discarded_bytes += entropy->bitstate.bits_left / 8;
  entropy->bitstate.bits_left = 0;

  /* Advance past the RSTn marker */
  if (! (*cinfo->marker->read_restart_marker) (cinfo))
    return FALSE;

  /* Re-initialize DC predictions to 0 */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++)
    entropy->saved.last_dc_val[ci] = 0;
  /* Re-init EOB run count, too */
  entropy->saved.EOBRUN = 0;

  /* Reset restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;

  /* Reset out-of-data flag, unless read_restart_marker left us smack up
   * against a marker.  In that case we will end up treating the next data
   * segment as empty, and we can avoid producing bogus output pixels by
   * leaving the flag set.
   */
  if (cinfo->unread_marker == 0)
    entropy->insufficient_data = FALSE;

  return TRUE;
}